

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O3

hugeint_t duckdb::DecimalScaleUpOperator::Operation<long,duckdb::hugeint_t>
                    (long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  hugeint_t hVar2;
  undefined1 auVar3 [16];
  hugeint_t result;
  string local_48;
  hugeint_t local_28;
  
  bVar1 = TryCast::Operation<long,duckdb::hugeint_t>(input,&local_28,false);
  if (bVar1) {
    local_48._M_dataplus._M_p = (pointer)local_28.lower;
    local_48._M_string_length = local_28.upper;
    hVar2 = hugeint_t::operator*((hugeint_t *)&local_48,(hugeint_t *)((long)dataptr + 0x28));
    return hVar2;
  }
  auVar3 = __cxa_allocate_exception(0x10);
  CastExceptionText<long,duckdb::hugeint_t>(&local_48,(duckdb *)input,auVar3._8_8_);
  InvalidInputException::InvalidInputException(auVar3._0_8_,(string *)&local_48);
  __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}